

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

SQInteger __thiscall SQCompiler::ChooseCompArithCharByToken(SQCompiler *this,SQInteger tok)

{
  undefined8 uStack_8;
  
  if (tok == 0x13f) {
    uStack_8 = 0x25;
  }
  else if (tok == 0x122) {
    uStack_8 = 0x2d;
  }
  else if (tok == 0x13d) {
    uStack_8 = 0x2a;
  }
  else if (tok == 0x13e) {
    uStack_8 = 0x2f;
  }
  else {
    if (tok != 0x121) {
      return 0;
    }
    uStack_8 = 0x2b;
  }
  return uStack_8;
}

Assistant:

SQInteger ChooseCompArithCharByToken(SQInteger tok)
    {
        SQInteger oper;
        switch(tok){
        case TK_MINUSEQ: oper = '-'; break;
        case TK_PLUSEQ: oper = '+'; break;
        case TK_MULEQ: oper = '*'; break;
        case TK_DIVEQ: oper = '/'; break;
        case TK_MODEQ: oper = '%'; break;
        default: oper = 0; //shut up compiler
            assert(0); break;
        };
        return oper;
    }